

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# displ.cpp
# Opt level: O2

void __thiscall displ::createWindow(displ *this,string *str,uint x,uint y,uint antialiasing)

{
  RenderTarget *this_00;
  locale alStack_78 [8];
  VideoMode local_70;
  ContextSettings local_64;
  undefined1 local_48 [12];
  float local_3c;
  
  local_64.depthBits = 0;
  local_64.stencilBits = 0;
  local_64.majorVersion = 1;
  local_64.minorVersion = 1;
  local_64.attributeFlags = 0;
  local_64.sRgbCapable = false;
  local_64.antialiasingLevel = antialiasing;
  sf::VideoMode::VideoMode(&local_70,x,y,0x20);
  std::locale::locale(alStack_78);
  sf::String::String((String *)local_48,str,alStack_78);
  sf::Window::create((Window *)this,local_70,(String *)local_48,7,&local_64);
  std::__cxx11::
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
  ~basic_string((basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
                 *)local_48);
  std::locale::~locale(alStack_78);
  local_48._8_4_ = (undefined4)x;
  local_3c = (float)y;
  local_48._0_8_ = (pointer)0x0;
  sf::View::reset(&this->view,(FloatRect *)local_48);
  this_00 = &(this->window).super_RenderTarget;
  sf::RenderTarget::setView(this_00,&this->view);
  sf::RenderTarget::clear(this_00,(Color *)&sf::Color::Black);
  sf::Window::display((Window *)this);
  zoom(this,0.3);
  setCenter(this,(this->box).x * 0.5,(this->box).y * 0.5);
  return;
}

Assistant:

void displ::createWindow(std::string str, unsigned x, unsigned y, unsigned antialiasing)
{
	sf::ContextSettings settings;
	//Z antyaliasingiem 0 działa bardzo szybko ale brzydko
	settings.antialiasingLevel = antialiasing;
	window.create(sf::VideoMode(x,y), str,sf::Style::Default, settings);	
	
	view.reset(sf::FloatRect( 0, 0, x, y));
	window.setView(view);
	
	window.clear(sf::Color::Black);
	window.display();

	zoom(0.3f);
    setCenter(box.getX()/2.f, box.getY()/2.f);
}